

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O0

optional<QDateTime> __thiscall QHttpHeaders::dateTimeValueAt(QHttpHeaders *this,qsizetype i)

{
  ulong uVar1;
  undefined8 extraout_RDX;
  _Storage<QDateTime,_false> in_RDI;
  long in_FS_OFFSET;
  optional<QDateTime> oVar2;
  QDateTime dt;
  undefined1 in_stack_00000098 [16];
  _Storage<QDateTime,_false> __t;
  qsizetype in_stack_ffffffffffffffa8;
  QHttpHeaders *in_stack_ffffffffffffffb0;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  __t = in_RDI;
  valueAt(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  QNetworkHeadersPrivate::fromHttpDate((QByteArrayView)in_stack_00000098);
  uVar1 = QDateTime::isValid();
  if ((uVar1 & 1) == 0) {
    std::optional<QDateTime>::optional((optional<QDateTime> *)__t.field2);
  }
  else {
    std::make_optional<QDateTime>((QDateTime *)__t);
  }
  QDateTime::~QDateTime((QDateTime *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    oVar2.super__Optional_base<QDateTime,_false,_false>._M_payload.
    super__Optional_payload<QDateTime,_true,_false,_false>.super__Optional_payload_base<QDateTime>.
    _8_8_ = extraout_RDX;
    oVar2.super__Optional_base<QDateTime,_false,_false>._M_payload.
    super__Optional_payload<QDateTime,_true,_false,_false>.super__Optional_payload_base<QDateTime>.
    _M_payload.field2 = in_RDI.field2;
    return (optional<QDateTime>)
           oVar2.super__Optional_base<QDateTime,_false,_false>._M_payload.
           super__Optional_payload<QDateTime,_true,_false,_false>.
           super__Optional_payload_base<QDateTime>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<QDateTime> QHttpHeaders::dateTimeValueAt(qsizetype i) const
{
    verify(i);
    QDateTime dt = QNetworkHeadersPrivate::fromHttpDate(valueAt(i));
    return dt.isValid() ? std::make_optional(std::move(dt)) :
                          std::nullopt;
}